

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

string * __thiscall
CoreML::Specification::Imputer::mutable_imputedstringvalue_abi_cxx11_(Imputer *this)

{
  bool bVar1;
  string *psVar2;
  Imputer *this_local;
  
  bVar1 = has_imputedstringvalue(this);
  if (!bVar1) {
    clear_ImputedValue(this);
    set_has_imputedstringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ImputedValue_).imputedstringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  psVar2 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ImputedValue_).imputedstringvalue_,psVar2);
  return psVar2;
}

Assistant:

inline ::std::string* Imputer::mutable_imputedstringvalue() {
  if (!has_imputedstringvalue()) {
    clear_ImputedValue();
    set_has_imputedstringvalue();
    ImputedValue_.imputedstringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.imputedStringValue)
  return ImputedValue_.imputedstringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}